

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O2

google_protobuf_FileDescriptorProto *
upb_ToProto_ConvertFileDef(upb_ToProto_Context *ctx,upb_FileDef *f)

{
  __jmp_buf_tag *__env;
  upb_Arena *a;
  undefined8 buf;
  _Bool _Var1;
  int iVar2;
  upb_Syntax uVar3;
  google_protobuf_Edition gVar4;
  upb_DecodeStatus uVar5;
  google_protobuf_FileDescriptorProto *msg;
  char *pcVar6;
  void *pvVar7;
  size_t *psVar8;
  upb_FileDef *f_00;
  int32_t *piVar9;
  upb_MessageDef *m;
  google_protobuf_DescriptorProto *pgVar10;
  upb_EnumDef *e;
  google_protobuf_EnumDescriptorProto *pgVar11;
  upb_ServiceDef *s;
  google_protobuf_ServiceDescriptorProto *pgVar12;
  upb_FieldDef *f_01;
  google_protobuf_FieldDescriptorProto *pgVar13;
  google_protobuf_FileOptions *msg_00;
  upb_Message *msg_01;
  size_t i;
  size_t sVar14;
  upb_StringView uVar15;
  upb_MiniTableField field;
  undefined4 uStack_44;
  size_t local_38;
  
  __env = ctx->err;
  iVar2 = _setjmp((__jmp_buf_tag *)__env);
  if (iVar2 != 0) {
    return (google_protobuf_FileDescriptorProto *)0x0;
  }
  msg = (google_protobuf_FileDescriptorProto *)
        _upb_Message_New(&google__protobuf__FileDescriptorProto_msg_init,ctx->arena);
  if (msg == (google_protobuf_FileDescriptorProto *)0x0) {
    longjmp((__jmp_buf_tag *)__env,1);
  }
  pcVar6 = upb_FileDef_Name(f);
  _field = strviewdup(ctx,pcVar6);
  upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_00130cf0,&field);
  pcVar6 = upb_FileDef_Package(f);
  if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
    _field = strviewdup(ctx,pcVar6);
    upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_00130cb4,&field);
  }
  uVar3 = upb_FileDef_Syntax(f);
  if (uVar3 == kUpb_Syntax_Editions) {
    gVar4 = upb_FileDef_Edition(f);
    field.number_dont_copy_me__upb_internal_use_only = gVar4;
    upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_00130c3c,&field);
  }
  uVar3 = upb_FileDef_Syntax(f);
  if (uVar3 == kUpb_Syntax_Proto3) {
    pcVar6 = "proto3";
  }
  else {
    uVar3 = upb_FileDef_Syntax(f);
    if (uVar3 != kUpb_Syntax_Editions) goto LAB_0011cb97;
    pcVar6 = "editions";
  }
  _field = strviewdup(ctx,pcVar6);
  upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_00130c48,&field);
LAB_0011cb97:
  iVar2 = upb_FileDef_DependencyCount(f);
  field.submsg_index_dont_copy_me__upb_internal_use_only = 0xffff;
  field.descriptortype_dont_copy_me__upb_internal_use_only = '\f';
  field.mode_dont_copy_me__upb_internal_use_only = 0xd1;
  field.number_dont_copy_me__upb_internal_use_only = 3;
  field.offset_dont_copy_me__upb_internal_use_only = 0x30;
  field.presence = 0;
  pvVar7 = upb_Message_ResizeArrayUninitialized((upb_Message *)msg,&field,(long)iVar2,ctx->arena);
  psVar8 = (size_t *)((long)pvVar7 + 8);
  for (sVar14 = 0; (long)iVar2 != sVar14; sVar14 = sVar14 + 1) {
    f_00 = upb_FileDef_Dependency(f,(int)sVar14);
    pcVar6 = upb_FileDef_Name(f_00);
    uVar15 = strviewdup(ctx,pcVar6);
    psVar8[-1] = (size_t)uVar15.data;
    *psVar8 = uVar15.size;
    psVar8 = psVar8 + 2;
  }
  iVar2 = upb_FileDef_PublicDependencyCount(f);
  field.submsg_index_dont_copy_me__upb_internal_use_only = 0xffff;
  field.descriptortype_dont_copy_me__upb_internal_use_only = '\x05';
  field.mode_dont_copy_me__upb_internal_use_only = 0xc1;
  field.number_dont_copy_me__upb_internal_use_only = 10;
  field.offset_dont_copy_me__upb_internal_use_only = 0x68;
  field.presence = 0;
  pvVar7 = upb_Message_ResizeArrayUninitialized((upb_Message *)msg,&field,(long)iVar2,ctx->arena);
  piVar9 = _upb_FileDef_PublicDependencyIndexes(f);
  if (iVar2 != 0) {
    memcpy(pvVar7,piVar9,(long)iVar2 << 2);
  }
  iVar2 = upb_FileDef_WeakDependencyCount(f);
  field.submsg_index_dont_copy_me__upb_internal_use_only = 0xffff;
  field.descriptortype_dont_copy_me__upb_internal_use_only = '\x05';
  field.mode_dont_copy_me__upb_internal_use_only = 0xc1;
  field.number_dont_copy_me__upb_internal_use_only = 0xb;
  field.offset_dont_copy_me__upb_internal_use_only = 0x70;
  field.presence = 0;
  pvVar7 = upb_Message_ResizeArrayUninitialized((upb_Message *)msg,&field,(long)iVar2,ctx->arena);
  piVar9 = _upb_FileDef_WeakDependencyIndexes(f);
  if (iVar2 != 0) {
    memcpy(pvVar7,piVar9,(long)iVar2 << 2);
  }
  iVar2 = upb_FileDef_TopLevelMessageCount(f);
  field.submsg_index_dont_copy_me__upb_internal_use_only = 0;
  field.descriptortype_dont_copy_me__upb_internal_use_only = '\v';
  field.mode_dont_copy_me__upb_internal_use_only = 0xc1;
  field.number_dont_copy_me__upb_internal_use_only = 4;
  field.offset_dont_copy_me__upb_internal_use_only = 0x38;
  field.presence = 0;
  pvVar7 = upb_Message_ResizeArrayUninitialized((upb_Message *)msg,&field,(long)iVar2,ctx->arena);
  for (sVar14 = 0; (long)iVar2 != sVar14; sVar14 = sVar14 + 1) {
    m = upb_FileDef_TopLevelMessage(f,(int)sVar14);
    pgVar10 = msgdef_toproto(ctx,m);
    *(google_protobuf_DescriptorProto **)((long)pvVar7 + sVar14 * 8) = pgVar10;
  }
  iVar2 = upb_FileDef_TopLevelEnumCount(f);
  field.submsg_index_dont_copy_me__upb_internal_use_only = 1;
  field.descriptortype_dont_copy_me__upb_internal_use_only = '\v';
  field.mode_dont_copy_me__upb_internal_use_only = 0xc1;
  field.number_dont_copy_me__upb_internal_use_only = 5;
  field.offset_dont_copy_me__upb_internal_use_only = 0x40;
  field.presence = 0;
  pvVar7 = upb_Message_ResizeArrayUninitialized((upb_Message *)msg,&field,(long)iVar2,ctx->arena);
  for (sVar14 = 0; (long)iVar2 != sVar14; sVar14 = sVar14 + 1) {
    e = upb_FileDef_TopLevelEnum(f,(int)sVar14);
    pgVar11 = enumdef_toproto(ctx,e);
    *(google_protobuf_EnumDescriptorProto **)((long)pvVar7 + sVar14 * 8) = pgVar11;
  }
  iVar2 = upb_FileDef_ServiceCount(f);
  field.submsg_index_dont_copy_me__upb_internal_use_only = 2;
  field.descriptortype_dont_copy_me__upb_internal_use_only = '\v';
  field.mode_dont_copy_me__upb_internal_use_only = 0xc1;
  field.number_dont_copy_me__upb_internal_use_only = 6;
  field.offset_dont_copy_me__upb_internal_use_only = 0x48;
  field.presence = 0;
  pvVar7 = upb_Message_ResizeArrayUninitialized((upb_Message *)msg,&field,(long)iVar2,ctx->arena);
  for (sVar14 = 0; (long)iVar2 != sVar14; sVar14 = sVar14 + 1) {
    s = upb_FileDef_Service(f,(int)sVar14);
    pgVar12 = servicedef_toproto(ctx,s);
    *(google_protobuf_ServiceDescriptorProto **)((long)pvVar7 + sVar14 * 8) = pgVar12;
  }
  iVar2 = upb_FileDef_TopLevelExtensionCount(f);
  field.submsg_index_dont_copy_me__upb_internal_use_only = 3;
  field.descriptortype_dont_copy_me__upb_internal_use_only = '\v';
  field.mode_dont_copy_me__upb_internal_use_only = 0xc1;
  field.number_dont_copy_me__upb_internal_use_only = 7;
  field.offset_dont_copy_me__upb_internal_use_only = 0x50;
  field.presence = 0;
  pvVar7 = upb_Message_ResizeArrayUninitialized((upb_Message *)msg,&field,(long)iVar2,ctx->arena);
  for (sVar14 = 0; (long)iVar2 != sVar14; sVar14 = sVar14 + 1) {
    f_01 = upb_FileDef_TopLevelExtension(f,(int)sVar14);
    pgVar13 = fielddef_toproto(ctx,f_01);
    *(google_protobuf_FieldDescriptorProto **)((long)pvVar7 + sVar14 * 8) = pgVar13;
  }
  _Var1 = upb_FileDef_HasOptions(f);
  if (_Var1) {
    msg_00 = upb_FileDef_Options(f);
    upb_Encode(&msg_00->base_dont_copy_me__upb_internal_use_only,
               &google__protobuf__FileOptions_msg_init,0,ctx->arena,(char **)&field,&local_38);
    buf = field._0_8_;
    if (field._0_8_ != 0) {
      a = ctx->arena;
      msg_01 = _upb_Message_New(&google__protobuf__FileOptions_msg_init,a);
      if ((msg_01 != (upb_Message *)0x0) &&
         (uVar5 = upb_Decode((char *)buf,local_38,msg_01,&google__protobuf__FileOptions_msg_init,
                             (upb_ExtensionRegistry *)0x0,0,a), uVar5 == kUpb_DecodeStatus_Ok)) {
        field._0_8_ = msg_01;
        upb_Message_SetBaseField((upb_Message *)msg,(upb_MiniTableField *)&DAT_00130ca8,&field);
        return msg;
      }
    }
    longjmp((__jmp_buf_tag *)__env,1);
  }
  return msg;
}

Assistant:

google_protobuf_FileDescriptorProto* upb_ToProto_ConvertFileDef(
    upb_ToProto_Context* const ctx, const upb_FileDef* const f) {
  if (UPB_SETJMP(ctx->err)) return NULL;
  return filedef_toproto(ctx, f);
}